

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transupp.c
# Opt level: O0

jvirt_barray_ptr *
jtransform_adjust_parameters
          (j_decompress_ptr srcinfo,j_compress_ptr dstinfo,jvirt_barray_ptr *src_coef_arrays,
          jpeg_transform_info *info)

{
  int iVar1;
  int *in_RCX;
  j_compress_ptr in_RDX;
  j_compress_ptr in_RSI;
  long in_RDI;
  boolean unaff_retaddr;
  jvirt_barray_ptr *in_stack_00000008;
  int sv_quant_tbl_no;
  j_compress_ptr in_stack_fffffffffffffff8;
  
  if (in_RCX[3] == 0) {
    if (in_RCX[0x12] == 1) {
      in_RSI->comp_info->h_samp_factor = 1;
      in_RSI->comp_info->v_samp_factor = 1;
    }
  }
  else if ((((in_RSI->jpeg_color_space == JCS_YCbCr) && (in_RSI->num_components == 3)) ||
           ((in_RSI->jpeg_color_space == JCS_GRAYSCALE && (in_RSI->num_components == 1)))) &&
          ((*(int *)(*(long *)(in_RDI + 0x130) + 8) == *(int *)(in_RDI + 0x198) &&
           (*(int *)(*(long *)(in_RDI + 0x130) + 0xc) == *(int *)(in_RDI + 0x19c))))) {
    iVar1 = in_RSI->comp_info->quant_tbl_no;
    jpeg_set_colorspace(in_RDX,(J_COLOR_SPACE)((ulong)in_RCX >> 0x20));
    in_RSI->comp_info->quant_tbl_no = iVar1;
  }
  else {
    in_RSI->err->msg_code = 0x1b;
    (*in_RSI->err->error_exit)((j_common_ptr)in_RSI);
  }
  iVar1 = *in_RCX;
  if ((iVar1 - 3U < 3) || (iVar1 == 7)) {
    in_RSI->image_width = in_RCX[0x17];
    in_RSI->image_height = in_RCX[0x16];
    transpose_critical_parameters(in_RSI);
  }
  else if (iVar1 == 9) {
    if ((in_RCX[0x1a] != 0) && (in_RCX[0x1b] != 0)) {
      adjust_quant((j_decompress_ptr)dstinfo,src_coef_arrays,(j_decompress_ptr)info,
                   in_stack_00000008,unaff_retaddr,in_stack_fffffffffffffff8);
    }
  }
  else {
    in_RSI->image_width = in_RCX[0x16];
    in_RSI->image_height = in_RCX[0x17];
  }
  if (((((((*(long *)(in_RDI + 400) != 0) && (*(char *)(*(long *)(in_RDI + 400) + 8) == -0x1f)) &&
         (5 < *(uint *)(*(long *)(in_RDI + 400) + 0x10))) &&
        ((**(char **)(*(long *)(in_RDI + 400) + 0x18) == 'E' &&
         (*(char *)(*(long *)(*(long *)(in_RDI + 400) + 0x18) + 1) == 'x')))) &&
       ((*(char *)(*(long *)(*(long *)(in_RDI + 400) + 0x18) + 2) == 'i' &&
        ((*(char *)(*(long *)(*(long *)(in_RDI + 400) + 0x18) + 3) == 'f' &&
         (*(char *)(*(long *)(*(long *)(in_RDI + 400) + 0x18) + 4) == '\0')))))) &&
      (*(char *)(*(long *)(*(long *)(in_RDI + 400) + 0x18) + 5) == '\0')) &&
     ((in_RSI->write_JFIF_header = 0, in_RSI->image_width != *(JDIMENSION *)(in_RDI + 0x30) ||
      (in_RSI->image_height != *(JDIMENSION *)(in_RDI + 0x34))))) {
    adjust_exif_parameters
              ((JOCTET *)(*(long *)(*(long *)(in_RDI + 400) + 0x18) + 6),
               *(int *)(*(long *)(in_RDI + 400) + 0x10) - 6,in_RSI->image_width,in_RSI->image_height
              );
  }
  if (*(long *)(in_RCX + 0x14) != 0) {
    in_RDX = *(j_compress_ptr *)(in_RCX + 0x14);
  }
  return (jvirt_barray_ptr *)in_RDX;
}

Assistant:

GLOBAL(jvirt_barray_ptr *)
jtransform_adjust_parameters(j_decompress_ptr srcinfo, j_compress_ptr dstinfo,
                             jvirt_barray_ptr *src_coef_arrays,
                             jpeg_transform_info *info)
{
  /* If force-to-grayscale is requested, adjust destination parameters */
  if (info->force_grayscale) {
    /* First, ensure we have YCbCr or grayscale data, and that the source's
     * Y channel is full resolution.  (No reasonable person would make Y
     * be less than full resolution, so actually coping with that case
     * isn't worth extra code space.  But we check it to avoid crashing.)
     */
    if (((dstinfo->jpeg_color_space == JCS_YCbCr &&
          dstinfo->num_components == 3) ||
         (dstinfo->jpeg_color_space == JCS_GRAYSCALE &&
          dstinfo->num_components == 1)) &&
        srcinfo->comp_info[0].h_samp_factor == srcinfo->max_h_samp_factor &&
        srcinfo->comp_info[0].v_samp_factor == srcinfo->max_v_samp_factor) {
      /* We use jpeg_set_colorspace to make sure subsidiary settings get fixed
       * properly.  Among other things, it sets the target h_samp_factor &
       * v_samp_factor to 1, which typically won't match the source.
       * We have to preserve the source's quantization table number, however.
       */
      int sv_quant_tbl_no = dstinfo->comp_info[0].quant_tbl_no;
      jpeg_set_colorspace(dstinfo, JCS_GRAYSCALE);
      dstinfo->comp_info[0].quant_tbl_no = sv_quant_tbl_no;
    } else {
      /* Sorry, can't do it */
      ERREXIT(dstinfo, JERR_CONVERSION_NOTIMPL);
    }
  } else if (info->num_components == 1) {
    /* For a single-component source, we force the destination sampling factors
     * to 1x1, with or without force_grayscale.  This is useful because some
     * decoders choke on grayscale images with other sampling factors.
     */
    dstinfo->comp_info[0].h_samp_factor = 1;
    dstinfo->comp_info[0].v_samp_factor = 1;
  }

  /* Correct the destination's image dimensions as necessary
   * for rotate/flip, resize, and crop operations.
   */
#if JPEG_LIB_VERSION >= 80
  dstinfo->jpeg_width = info->output_width;
  dstinfo->jpeg_height = info->output_height;
#endif

  /* Transpose destination image parameters, adjust quantization */
  switch (info->transform) {
  case JXFORM_TRANSPOSE:
  case JXFORM_TRANSVERSE:
  case JXFORM_ROT_90:
  case JXFORM_ROT_270:
#if JPEG_LIB_VERSION < 80
    dstinfo->image_width = info->output_height;
    dstinfo->image_height = info->output_width;
#endif
    transpose_critical_parameters(dstinfo);
    break;
  case JXFORM_DROP:
    if (info->drop_width != 0 && info->drop_height != 0)
      adjust_quant(srcinfo, src_coef_arrays,
                   info->drop_ptr, info->drop_coef_arrays,
                   info->trim, dstinfo);
    break;
  default:
#if JPEG_LIB_VERSION < 80
    dstinfo->image_width = info->output_width;
    dstinfo->image_height = info->output_height;
#endif
    break;
  }

  /* Adjust Exif properties */
  if (srcinfo->marker_list != NULL &&
      srcinfo->marker_list->marker == JPEG_APP0 + 1 &&
      srcinfo->marker_list->data_length >= 6 &&
      srcinfo->marker_list->data[0] == 0x45 &&
      srcinfo->marker_list->data[1] == 0x78 &&
      srcinfo->marker_list->data[2] == 0x69 &&
      srcinfo->marker_list->data[3] == 0x66 &&
      srcinfo->marker_list->data[4] == 0 &&
      srcinfo->marker_list->data[5] == 0) {
    /* Suppress output of JFIF marker */
    dstinfo->write_JFIF_header = FALSE;
    /* Adjust Exif image parameters */
#if JPEG_LIB_VERSION >= 80
    if (dstinfo->jpeg_width != srcinfo->image_width ||
        dstinfo->jpeg_height != srcinfo->image_height)
      /* Align data segment to start of TIFF structure for parsing */
      adjust_exif_parameters(srcinfo->marker_list->data + 6,
                             srcinfo->marker_list->data_length - 6,
                             dstinfo->jpeg_width, dstinfo->jpeg_height);
#else
    if (dstinfo->image_width != srcinfo->image_width ||
        dstinfo->image_height != srcinfo->image_height)
      /* Align data segment to start of TIFF structure for parsing */
      adjust_exif_parameters(srcinfo->marker_list->data + 6,
                             srcinfo->marker_list->data_length - 6,
                             dstinfo->image_width, dstinfo->image_height);
#endif
  }

  /* Return the appropriate output data set */
  if (info->workspace_coef_arrays != NULL)
    return info->workspace_coef_arrays;
  return src_coef_arrays;
}